

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O3

void __thiscall
google::protobuf::Reflection::SetString
          (Reflection *this,Message *message,FieldDescriptor *field,string *value)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint *puVar2;
  ReflectionSchema *this_00;
  FieldDescriptor type;
  uint uVar3;
  int number;
  long lVar4;
  bool bVar5;
  uint32 uVar6;
  undefined8 *puVar7;
  string *psVar8;
  ulong uVar9;
  long *plVar10;
  OneofDescriptor *oneof_descriptor;
  Arena *arena;
  string *this_01;
  ArenaStringPtr *this_02;
  FieldDescriptor *local_60;
  _func_void_FieldDescriptor_ptr *local_58;
  size_type *local_50;
  size_type local_48;
  size_type local_40;
  undefined8 uStack_38;
  
  if (*(Descriptor **)(field + 0x50) != this->descriptor_) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetString","Field does not match message type.");
  }
  if (*(int *)(field + 0x3c) == 3) {
    anon_unknown_0::ReportReflectionUsageError
              (this->descriptor_,field,"SetString",
               "Field is repeated; the method requires a singular field.");
  }
  if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
    local_58 = FieldDescriptor::TypeOnceInit;
    local_60 = field;
    std::
    call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
              (*(once_flag **)(field + 0x30),&local_58,&local_60);
  }
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(uint *)(field + 0x38) * 4) != 9) {
    anon_unknown_0::ReportReflectionUsageTypeError
              (this->descriptor_,field,"SetString",CPPTYPE_STRING);
  }
  if (field[0x42] == (FieldDescriptor)0x1) {
    uVar3 = (this->schema_).extensions_offset_;
    number = *(int *)(field + 0x44);
    if (*(once_flag **)(field + 0x30) != (once_flag *)0x0) {
      local_58 = FieldDescriptor::TypeOnceInit;
      local_60 = field;
      std::
      call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                (*(once_flag **)(field + 0x30),&local_58,&local_60);
    }
    type = field[0x38];
    local_50 = (size_type *)(value->_M_dataplus)._M_p;
    paVar1 = &value->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50 == paVar1) {
      local_40 = paVar1->_M_allocated_capacity;
      uStack_38 = *(undefined8 *)((long)&value->field_2 + 8);
      local_50 = &local_40;
    }
    else {
      local_40 = paVar1->_M_allocated_capacity;
    }
    local_48 = value->_M_string_length;
    (value->_M_dataplus)._M_p = (pointer)paVar1;
    value->_M_string_length = 0;
    (value->field_2)._M_local_buf[0] = '\0';
    psVar8 = internal::ExtensionSet::MutableString_abi_cxx11_
                       ((ExtensionSet *)
                        ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),
                        number,(FieldType)type,field);
    std::__cxx11::string::operator=((string *)psVar8,(string *)&local_50);
    if (local_50 == &local_40) {
      return;
    }
    operator_delete(local_50);
    return;
  }
  this_00 = &this->schema_;
  bVar5 = internal::ReflectionSchema::IsFieldInlined(this_00,field);
  if (bVar5) {
    lVar4 = *(long *)(field + 0x58);
    if (lVar4 == 0) {
      uVar9 = (ulong)(uint)(this->schema_).has_bits_offset_;
      if (uVar9 != 0xffffffff) {
        if (field[0x42] == (FieldDescriptor)0x0) {
          plVar10 = (long *)(*(long *)(field + 0x50) + 0x28);
        }
        else if (*(long *)(field + 0x60) == 0) {
          plVar10 = (long *)(*(long *)(field + 0x28) + 0x80);
        }
        else {
          plVar10 = (long *)(*(long *)(field + 0x60) + 0x50);
        }
        uVar3 = (this->schema_).has_bit_indices_
                [(int)((ulong)((long)field - *plVar10) >> 3) * 0x286bca1b];
        puVar2 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                         (ulong)(uVar3 >> 5) * 4 + uVar9);
        *puVar2 = *puVar2 | 1 << ((byte)uVar3 & 0x1f);
      }
    }
    else {
      *(undefined4 *)
       ((long)&(message->super_MessageLite)._vptr_MessageLite +
       (ulong)(uint)((int)((ulong)(lVar4 - *(long *)(*(long *)(lVar4 + 0x10) + 0x30)) >> 4) *
                     -0x55555554 + (this->schema_).oneof_case_offset_)) =
           *(undefined4 *)(field + 0x44);
    }
    uVar6 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
    this_01 = (string *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6);
    goto LAB_0027f8a5;
  }
  puVar7 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(this_00,field);
  psVar8 = (string *)*puVar7;
  oneof_descriptor = *(OneofDescriptor **)(field + 0x58);
  if (oneof_descriptor == (OneofDescriptor *)0x0) {
LAB_0027f80d:
    uVar9 = (ulong)(uint)(this->schema_).has_bits_offset_;
    if (uVar9 != 0xffffffff) {
      if (field[0x42] == (FieldDescriptor)0x0) {
        plVar10 = (long *)(*(long *)(field + 0x50) + 0x28);
      }
      else if (*(long *)(field + 0x60) == 0) {
        plVar10 = (long *)(*(long *)(field + 0x28) + 0x80);
      }
      else {
        plVar10 = (long *)(*(long *)(field + 0x60) + 0x50);
      }
      uVar3 = (this->schema_).has_bit_indices_
              [(int)((ulong)((long)field - *plVar10) >> 3) * 0x286bca1b];
      puVar2 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                       (ulong)(uVar3 >> 5) * 4 + uVar9);
      *puVar2 = *puVar2 | 1 << ((byte)uVar3 & 0x1f);
    }
  }
  else {
    if (*(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                           *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >>
                                   4) * -0x55555554 + (this->schema_).oneof_case_offset_)) !=
        *(int *)(field + 0x44)) {
      ClearOneof(this,message,oneof_descriptor);
      lVar4 = *(long *)(field + 0x58);
      if (lVar4 == 0) {
        uVar9 = (ulong)(uint)(this->schema_).has_bits_offset_;
        if (uVar9 != 0xffffffff) {
          if (field[0x42] == (FieldDescriptor)0x0) {
            plVar10 = (long *)(*(long *)(field + 0x50) + 0x28);
          }
          else if (*(long *)(field + 0x60) == 0) {
            plVar10 = (long *)(*(long *)(field + 0x28) + 0x80);
          }
          else {
            plVar10 = (long *)(*(long *)(field + 0x60) + 0x50);
          }
          uVar3 = (this->schema_).has_bit_indices_
                  [(int)((ulong)((long)field - *plVar10) >> 3) * 0x286bca1b];
          puVar2 = (uint *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                           (ulong)(uVar3 >> 5) * 4 + uVar9);
          *puVar2 = *puVar2 | 1 << ((byte)uVar3 & 0x1f);
        }
      }
      else {
        *(undefined4 *)
         ((long)&(message->super_MessageLite)._vptr_MessageLite +
         (ulong)(uint)((int)((ulong)(lVar4 - *(long *)(*(long *)(lVar4 + 0x10) + 0x30)) >> 4) *
                       -0x55555554 + (this->schema_).oneof_case_offset_)) =
             *(undefined4 *)(field + 0x44);
      }
      uVar6 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
      *(string **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6) = psVar8;
      oneof_descriptor = *(OneofDescriptor **)(field + 0x58);
      if (oneof_descriptor == (OneofDescriptor *)0x0) goto LAB_0027f80d;
    }
    *(undefined4 *)
     ((long)&(message->super_MessageLite)._vptr_MessageLite +
     (ulong)(uint)((int)((ulong)((long)oneof_descriptor -
                                *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) >> 4) *
                   -0x55555554 + (this->schema_).oneof_case_offset_)) =
         *(undefined4 *)(field + 0x44);
  }
  uVar6 = internal::ReflectionSchema::GetFieldOffset(this_00,field);
  this_02 = (ArenaStringPtr *)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar6)
  ;
  arena = *(Arena **)
           ((long)&(message->super_MessageLite)._vptr_MessageLite +
           (ulong)(uint)(this->schema_).metadata_offset_);
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
  }
  this_01 = this_02->ptr_;
  if (this_01 == psVar8) {
    internal::ArenaStringPtr::CreateInstance(this_02,arena,psVar8);
    this_01 = this_02->ptr_;
  }
LAB_0027f8a5:
  std::__cxx11::string::operator=((string *)this_01,(string *)value);
  return;
}

Assistant:

void Reflection::SetString(Message* message, const FieldDescriptor* field,
                           std::string value) const {
  USAGE_CHECK_ALL(SetString, SINGULAR, STRING);
  if (field->is_extension()) {
    return MutableExtensionSet(message)->SetString(field->number(),
                                                   field->type(), std::move(value), field);
  } else {
    switch (field->options().ctype()) {
      default:  // TODO(kenton):  Support other string reps.
      case FieldOptions::STRING: {
        if (IsInlined(field)) {
          MutableField<InlinedStringField>(message, field)
              ->SetNoArena(nullptr, std::move(value));
          break;
        }

        const std::string* default_ptr =
            &DefaultRaw<ArenaStringPtr>(field).Get();
        if (field->containing_oneof() && !HasOneofField(*message, field)) {
          ClearOneof(message, field->containing_oneof());
          MutableField<ArenaStringPtr>(message, field)
              ->UnsafeSetDefault(default_ptr);
        }
        MutableField<ArenaStringPtr>(message, field)
            ->Mutable(default_ptr, GetArena(message))->assign(std::move(value));
        break;
      }
    }
  }
}